

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnightBoard.cpp
# Opt level: O0

void __thiscall KnightBoard::printBoard(KnightBoard *this)

{
  Square *pSVar1;
  ostream *poVar2;
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  KnightBoard *this_local;
  
  for (local_14 = 0; local_14 < this->size; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < this->size; local_18 = local_18 + 1) {
      pSVar1 = getSquare(this,local_14,local_18);
      if ((pSVar1->containsKnight & 1U) == 0) {
        pSVar1 = getSquare(this,local_14,local_18);
        poVar2 = std::operator<<((ostream *)&std::cout,pSVar1->symbol);
        std::operator<<(poVar2," ");
      }
      else {
        std::operator<<((ostream *)&std::cout,"K ");
      }
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void KnightBoard::printBoard() {
    for (unsigned int i = 0; i < size; i++) {
        for (unsigned int j = 0; j < size; j++) {
            if(this->getSquare(i,j)->containsKnight)
                cout<<"K ";
            else
                cout << this->getSquare(i, j)->symbol<<" ";
        }
        cout << endl;
    }
    cout << endl;
}